

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O1

void __thiscall
TypeFunction::TypeFunction
          (TypeFunction *this,InplaceStr name,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  byte bVar1;
  uint uVar2;
  TypeHandle *el;
  TypeHandle *pTVar3;
  
  pTVar3 = arguments.head;
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00248770;
  (this->super_TypeBase).typeID = 0x15;
  (this->super_TypeBase).name.begin = name.begin;
  (this->super_TypeBase).name.end = name.end;
  (this->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (this->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar2 = NULLC::GetStringHash(name.begin,name.end);
  (this->super_TypeBase).nameHash = uVar2;
  (this->super_TypeBase).importModule = (ModuleData *)0x0;
  (this->super_TypeBase).typeIndex = 0xffffffff;
  (this->super_TypeBase).refType = (TypeRef *)0x0;
  (this->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(this->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(this->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(this->super_TypeBase).padding + 3) = 0;
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00248850;
  this->returnType = returnType;
  (this->arguments).head = pTVar3;
  (this->arguments).tail = arguments.tail;
  (this->super_TypeBase).size = 0xc;
  bVar1 = returnType->isGeneric;
  (this->super_TypeBase).isGeneric = (bool)bVar1;
  for (; pTVar3 != (TypeHandle *)0x0; pTVar3 = pTVar3->next) {
    bVar1 = bVar1 | pTVar3->type->isGeneric;
    (this->super_TypeBase).isGeneric = (bool)bVar1;
  }
  (this->super_TypeBase).hasPointers = true;
  return;
}

Assistant:

TypeFunction(InplaceStr name, TypeBase *returnType, IntrusiveList<TypeHandle> arguments): TypeBase(myTypeID, name), returnType(returnType), arguments(arguments)
	{
		size = 4 + NULLC_PTR_SIZE;

		isGeneric = returnType->isGeneric;

		for(TypeHandle *el = arguments.head; el; el = el->next)
			isGeneric |= el->type->isGeneric;

		hasPointers = true;
	}